

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_util.cc
# Opt level: O0

bool bssl::IPAddressMatchesWithNetmask(Input addr1,Input addr2,Input mask)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  size_t sVar6;
  ulong local_48;
  size_t i;
  Input mask_local;
  Input addr2_local;
  Input addr1_local;
  
  addr2_local.data_.data_ = (uchar *)addr2.data_.size_;
  mask_local.data_.size_ = (size_t)addr2.data_.data_;
  addr2_local.data_.size_ = (size_t)addr1.data_.data_;
  mask_local.data_.data_ = (uchar *)mask.data_.size_;
  i = (size_t)mask.data_.data_;
  sVar5 = der::Input::size((Input *)&addr2_local.data_.size_);
  sVar6 = der::Input::size((Input *)&mask_local.data_.size_);
  if (sVar5 == sVar6) {
    sVar5 = der::Input::size((Input *)&addr2_local.data_.size_);
    sVar6 = der::Input::size((Input *)&i);
    if (sVar5 == sVar6) {
      local_48 = 0;
      while( true ) {
        sVar5 = der::Input::size((Input *)&addr2_local.data_.size_);
        if (sVar5 <= local_48) {
          return true;
        }
        bVar1 = der::Input::operator[]((Input *)&addr2_local.data_.size_,local_48);
        bVar2 = der::Input::operator[]((Input *)&i,local_48);
        bVar3 = der::Input::operator[]((Input *)&mask_local.data_.size_,local_48);
        bVar4 = der::Input::operator[]((Input *)&i,local_48);
        if ((bVar1 & bVar2) != (bVar3 & bVar4)) break;
        local_48 = local_48 + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool IPAddressMatchesWithNetmask(der::Input addr1, der::Input addr2,
                                 der::Input mask) {
  if (addr1.size() != addr2.size() || addr1.size() != mask.size()) {
    return false;
  }
  for (size_t i = 0; i < addr1.size(); i++) {
    if ((addr1[i] & mask[i]) != (addr2[i] & mask[i])) {
      return false;
    }
  }
  return true;
}